

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DMovePoly::Tick(DMovePoly *this)

{
  bool bVar1;
  int iVar2;
  TVector2<double> local_30;
  double local_20;
  double absSpeed;
  FPolyObj *poly;
  DMovePoly *this_local;
  
  poly = (FPolyObj *)this;
  absSpeed = (double)PO_GetPolyobj((this->super_DPolyAction).m_PolyObj);
  if (((FPolyObj *)absSpeed != (FPolyObj *)0x0) &&
     (bVar1 = FPolyObj::MovePolyobj((FPolyObj *)absSpeed,&this->m_Speedv,false), bVar1)) {
    local_20 = ABS((this->super_DPolyAction).m_Speed);
    (this->super_DPolyAction).m_Dist = (this->super_DPolyAction).m_Dist - local_20;
    if (0.0 < (this->super_DPolyAction).m_Dist) {
      if ((this->super_DPolyAction).m_Dist < local_20) {
        iVar2 = 1;
        if ((this->super_DPolyAction).m_Speed < 0.0) {
          iVar2 = -1;
        }
        (this->super_DPolyAction).m_Speed = (this->super_DPolyAction).m_Dist * (double)iVar2;
        TAngle<double>::ToVector((TAngle<double> *)&local_30,(this->super_DPolyAction).m_Speed);
        TVector2<double>::operator=(&this->m_Speedv,&local_30);
      }
    }
    else {
      SN_StopSequence((FPolyObj *)absSpeed);
      (*(this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject[4])();
    }
    FPolyObj::UpdateLinks((FPolyObj *)absSpeed);
  }
  return;
}

Assistant:

void DMovePoly::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly != NULL)
	{
		if (poly->MovePolyobj (m_Speedv))
		{
			double absSpeed = fabs (m_Speed);
			m_Dist -= absSpeed;
			if (m_Dist <= 0)
			{
				SN_StopSequence (poly);
				Destroy ();
			}
			else if (m_Dist < absSpeed)
			{
				m_Speed = m_Dist * (m_Speed < 0 ? -1 : 1);
				m_Speedv = m_Angle.ToVector(m_Speed);
			}
			poly->UpdateLinks();
		}
	}
}